

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O0

Position * __thiscall iDynTree::Position::operator-(Position *this,Position *other)

{
  Position *in_RSI;
  Position *in_RDI;
  Position *in_stack_ffffffffffffffd8;
  Position *op1;
  
  op1 = in_RDI;
  inverse(in_stack_ffffffffffffffd8);
  compose(op1,in_RSI);
  return in_RDI;
}

Assistant:

Position Position::operator-(const Position& other) const
    {
        return compose(*this,inverse(other));
    }